

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O0

MallocBlock * MallocBlock::Allocate(size_t size,int type)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  int *piVar4;
  char *pcVar5;
  SizeMap *this;
  ThreadCache *pTVar6;
  size_t sVar7;
  ThreadCachePtr TVar8;
  SafeStrError local_158;
  SafeStrError local_130;
  void *local_108;
  char *p;
  int num_pages;
  int pagesize;
  size_t sz;
  bool malloc_page_fence_readable;
  MallocBlock *pMStack_e8;
  bool use_malloc_page_fence;
  MallocBlock *b;
  size_t sStack_d8;
  int type_local;
  size_t size_local;
  size_t local_c8;
  size_t allocated_size;
  ThreadCache *pTStack_b8;
  uint32_t cl;
  undefined1 local_b0;
  undefined1 local_a8 [8];
  ThreadCachePtr cache_ptr;
  MallocBlock *local_90;
  uint local_84;
  long lStack_80;
  uint32_t idx;
  bool local_78;
  undefined7 uStack_77;
  SizeMap *local_70;
  undefined1 local_61;
  uint *local_60;
  bool local_58;
  undefined7 uStack_57;
  char local_49;
  MallocBlock *local_48;
  MallocBlock *local_40;
  void *rv;
  FreeList *list;
  uint local_24;
  size_t local_20;
  ThreadCache *local_18;
  MallocBlock *local_10;
  
  b._4_4_ = type;
  sStack_d8 = size;
  if (Allocate::max_size_t - 0x30 < size) {
    RAW_LOG(-3,"Massive size passed to malloc: %zu",size);
    size_local = 0;
  }
  else {
    pMStack_e8 = (MallocBlock *)0x0;
    sz._7_1_ = FLAG__namespace_do_not_use_directly_use_DECLARE_bool_instead::FLAGS_malloc_page_fence
               & 1;
    sz._6_1_ = FLAG__namespace_do_not_use_directly_use_DECLARE_bool_instead::
               FLAGS_malloc_page_fence_readable & 1;
    if (sz._7_1_ == 0) {
      cache_ptr._8_8_ = real_malloced_size(size);
      TVar8 = tcmalloc::ThreadCachePtr::Grab();
      pTStack_b8 = TVar8.ptr_;
      local_b0 = TVar8.is_emergency_malloc_;
      local_a8 = (undefined1  [8])pTStack_b8;
      cache_ptr.ptr_._0_1_ = local_b0;
      bVar1 = tcmalloc::ThreadCachePtr::IsEmergencyMallocEnabled((ThreadCachePtr *)local_a8);
      if (bVar1) {
        local_90 = (MallocBlock *)tcmalloc::EmergencyMalloc(cache_ptr._8_8_);
      }
      else {
        local_70 = tcmalloc::Static::sizemap();
        local_78 = cache_ptr.is_emergency_malloc_;
        uStack_77 = cache_ptr._9_7_;
        lStack_80 = (long)&allocated_size + 4;
        local_58 = cache_ptr.is_emergency_malloc_;
        uStack_57 = cache_ptr._9_7_;
        local_60 = &local_84;
        if ((ulong)cache_ptr._8_8_ < 0x401) {
          local_84 = cache_ptr._8_4_ + 7U >> 3;
          local_49 = '\x01';
        }
        else if ((ulong)cache_ptr._8_8_ < 0x40001) {
          local_84 = cache_ptr._8_4_ + 0x3c7fU >> 7;
          local_49 = '\x01';
        }
        else {
          local_49 = '\0';
        }
        local_61 = local_49 != '\0';
        if ((bool)local_61) {
          allocated_size._4_4_ = (uint)local_70->class_array_[local_84];
          this = tcmalloc::Static::sizemap();
          iVar3 = tcmalloc::SizeMap::class_to_size(this,allocated_size._4_4_);
          local_c8 = (size_t)iVar3;
          pTVar6 = tcmalloc::ThreadCachePtr::operator->((ThreadCachePtr *)local_a8);
          bVar1 = tcmalloc::ThreadCache::SampleAllocation(pTVar6,local_c8);
          if (bVar1) {
            local_90 = (MallocBlock *)DoSampledAllocation(cache_ptr._8_8_);
          }
          else {
            pTVar6 = tcmalloc::ThreadCachePtr::operator->((ThreadCachePtr *)local_a8);
            local_20 = local_c8;
            local_24 = allocated_size._4_4_;
            list = (FreeList *)anon_unknown.dwarf_5601::nop_oom_handler;
            rv = pTVar6->list_ + allocated_size._4_4_;
            local_18 = pTVar6;
            iVar3 = tcmalloc::ThreadCache::FreeList::object_size((FreeList *)rv);
            local_20 = (size_t)iVar3;
            bVar1 = tcmalloc::ThreadCache::FreeList::TryPop((FreeList *)rv,&local_40);
            if (bVar1) {
              pTVar6->size_ = pTVar6->size_ - (int32_t)local_20;
              local_10 = local_40;
            }
            else {
              local_10 = (MallocBlock *)
                         tcmalloc::ThreadCache::FetchFromCentralCache
                                   (pTVar6,local_24,(int32_t)local_20,(_func_void_ptr_size_t *)list)
              ;
            }
            local_48 = local_10;
            local_90 = local_10;
          }
        }
        else {
          pTVar6 = tcmalloc::ThreadCachePtr::get((ThreadCachePtr *)local_a8);
          local_90 = (MallocBlock *)anon_unknown.dwarf_5601::do_malloc_pages(pTVar6,cache_ptr._8_8_)
          ;
        }
      }
      pMStack_e8 = local_90;
    }
    else {
      _num_pages = real_mmapped_size(size);
      p._4_4_ = getpagesize();
      p._0_4_ = (int)(((_num_pages + (long)p._4_4_) - 1) / (ulong)(long)p._4_4_) + 1;
      local_108 = mmap((void *)0x0,(long)((int)p * p._4_4_),3,0x22,-1,0);
      if (local_108 == (void *)0xffffffffffffffff) {
        piVar4 = __errno_location();
        tcmalloc::SafeStrError::SafeStrError(&local_130,*piVar4);
        pcVar5 = tcmalloc::SafeStrError::c_str(&local_130);
        RAW_LOG(-4,"Out of memory: possibly due to page fence overhead: %s",pcVar5);
      }
      iVar2 = mprotect((void *)((long)local_108 + (long)(((int)p + -1) * p._4_4_)),(long)p._4_4_,
                       (uint)((sz._6_1_ & 1) != 0));
      if (iVar2 != 0) {
        piVar4 = __errno_location();
        tcmalloc::SafeStrError::SafeStrError(&local_158,*piVar4);
        pcVar5 = tcmalloc::SafeStrError::c_str(&local_158);
        RAW_LOG(-4,"Guard page setup failed: %s",pcVar5);
      }
      pMStack_e8 = (MallocBlock *)((long)local_108 + ((long)(((int)p + -1) * p._4_4_) - _num_pages))
      ;
    }
    if (pMStack_e8 != (MallocBlock *)0x0) {
      sVar7 = 0xdeadbeef;
      if ((sz._7_1_ & 1) != 0) {
        sVar7 = 0xabcdefab;
      }
      pMStack_e8->magic1_ = sVar7;
      Initialize(pMStack_e8,sStack_d8,b._4_4_);
    }
    size_local = (size_t)pMStack_e8;
  }
  return (MallocBlock *)size_local;
}

Assistant:

static MallocBlock* Allocate(size_t size, int type) {
    // Prevent an integer overflow / crash with large allocation sizes.
    // TODO - Note that for a e.g. 64-bit size_t, max_size_t may not actually
    // be the maximum value, depending on how the compiler treats ~0. The worst
    // practical effect is that allocations are limited to 4Gb or so, even if
    // the address space could take more.
    static size_t max_size_t = ~0;
    if (size > max_size_t - sizeof(MallocBlock)) {
      RAW_LOG(ERROR, "Massive size passed to malloc: %zu", size);
      return nullptr;
    }
    MallocBlock* b = nullptr;
    const bool use_malloc_page_fence = FLAGS_malloc_page_fence;
    const bool malloc_page_fence_readable = FLAGS_malloc_page_fence_readable;
#ifdef HAVE_MMAP
    if (use_malloc_page_fence) {
      // Put the block towards the end of the page and make the next page
      // inaccessible. This will catch buffer overrun right when it happens.
      size_t sz = real_mmapped_size(size);
      int pagesize = getpagesize();
      int num_pages = (sz + pagesize - 1) / pagesize + 1;
      char* p = (char*) mmap(nullptr, num_pages * pagesize, PROT_READ|PROT_WRITE,
                             MAP_PRIVATE|MAP_ANONYMOUS, -1, 0);
      if (p == MAP_FAILED) {
        // If the allocation fails, abort rather than returning nullptr to
        // malloc. This is because in most cases, the program will run out
        // of memory in this mode due to tremendous amount of wastage. There
        // is no point in propagating the error elsewhere.
        RAW_LOG(FATAL, "Out of memory: possibly due to page fence overhead: %s",
                tcmalloc::SafeStrError(errno).c_str());
      }
      // Mark the page after the block inaccessible
      if (mprotect(p + (num_pages - 1) * pagesize, pagesize,
                   PROT_NONE|(malloc_page_fence_readable ? PROT_READ : 0))) {
        RAW_LOG(FATAL, "Guard page setup failed: %s",
                tcmalloc::SafeStrError(errno).c_str());
      }
      b = (MallocBlock*) (p + (num_pages - 1) * pagesize - sz);
    } else {
      b = (MallocBlock*) do_malloc(real_malloced_size(size));
    }
#else
    b = (MallocBlock*) do_malloc(real_malloced_size(size));
#endif

    // It would be nice to output a diagnostic on allocation failure
    // here, but logging (other than FATAL) requires allocating
    // memory, which could trigger a nasty recursion. Instead, preserve
    // malloc semantics and return nullptr on failure.
    if (b != nullptr) {
      b->magic1_ = use_malloc_page_fence ? kMagicMMap : kMagicMalloc;
      b->Initialize(size, type);
    }
    return b;
  }